

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_merge_siblings(lyd_node *target,lyd_node *source,int options)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  lyd_node *plVar2;
  bool bVar3;
  int iVar4;
  ly_ctx *ctx;
  int clear_flag;
  int ret;
  lyd_node *ins;
  lyd_node *src_backup;
  lyd_node *src;
  lyd_node *trg;
  lyd_node *plStack_20;
  int options_local;
  lyd_node *source_local;
  lyd_node *target_local;
  
  bVar3 = false;
  ctx_00 = target->schema->module->ctx;
  source_local = target;
  while (plVar2 = source, plStack_20 = source, source_local->prev->next != (lyd_node *)0x0) {
    source_local = source_local->prev;
  }
  do {
    src_backup = plVar2;
    if (src_backup == (lyd_node *)0x0) {
      lyd_free_withsiblings(plStack_20);
      if (bVar3) {
        target_local._4_4_ = 2;
      }
      else {
        target_local._4_4_ = 0;
      }
      return target_local._4_4_;
    }
    plVar2 = src_backup->next;
    for (src = source_local; src != (lyd_node *)0x0; src = src->next) {
      ctx._4_4_ = lyd_merge_node_schema_equal(src,src_backup);
      if (ctx._4_4_ == 1) {
        ctx._4_4_ = lyd_merge_node_equal(src,src_backup);
      }
      if (0 < ctx._4_4_) {
        if (ctx._4_4_ == 2) {
          bVar3 = true;
        }
        LVar1 = src->schema->nodetype;
        if (LVar1 == LYS_CONTAINER) {
LAB_0019e660:
          iVar4 = lyd_merge_parent_children(src,src_backup->child,options);
          if (iVar4 == 2) {
            bVar3 = true;
          }
          else if (iVar4 != 0) {
            lyd_free_withsiblings(plStack_20);
            return 1;
          }
        }
        else {
          if (LVar1 != LYS_LEAF) {
            if (LVar1 == LYS_LEAFLIST) break;
            if (LVar1 == LYS_LIST) goto LAB_0019e660;
            if (LVar1 != LYS_ANYXML) {
              if ((((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_INPUT)) ||
                 (LVar1 == LYS_OUTPUT)) goto LAB_0019e660;
              if (LVar1 != LYS_ANYDATA) {
                ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                       ,0xb79);
                lyd_free_withsiblings(plStack_20);
                return 1;
              }
            }
          }
          lyd_merge_node_update(src,src_backup);
        }
        break;
      }
      if (ctx._4_4_ == -1) {
        lyd_free_withsiblings(plStack_20);
        return 1;
      }
    }
    if (src == (lyd_node *)0x0) {
      if (ctx_00 == src_backup->schema->module->ctx) {
        lyd_unlink(src_backup);
        if (src_backup == plStack_20) {
          plStack_20 = plVar2;
        }
        _clear_flag = src_backup;
      }
      else {
        _clear_flag = lyd_dup_to_ctx(src_backup,1,ctx_00);
      }
      lyd_insert_after(source_local->prev,_clear_flag);
    }
  } while( true );
}

Assistant:

static int
lyd_merge_siblings(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg, *src, *src_backup, *ins;
    int ret, clear_flag = 0;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    while (target->prev->next) {
        target = target->prev;
    }

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        LY_TREE_FOR(target, trg) {
            /* sibling found, merge it */
            ret = lyd_merge_node_schema_equal(trg, src);
            if (ret == 1) {
                ret = lyd_merge_node_equal(trg, src);
            }
            if (ret > 0) {
                if (ret == 2) {
                    clear_flag = 1;
                }

                switch (trg->schema->nodetype) {
                case LYS_LEAF:
                case LYS_ANYXML:
                case LYS_ANYDATA:
                    lyd_merge_node_update(trg, src);
                    break;
                case LYS_LEAFLIST:
                    /* it's already there, nothing to do */
                    break;
                case LYS_LIST:
                case LYS_CONTAINER:
                case LYS_NOTIF:
                case LYS_RPC:
                case LYS_INPUT:
                case LYS_OUTPUT:
                    ret = lyd_merge_parent_children(trg, src->child, options);
                    if (ret == 2) {
                        clear_flag = 1;
                    } else if (ret) {
                        lyd_free_withsiblings(source);
                        return 1;
                    }
                    break;
                default:
                    LOGINT(ctx);
                    lyd_free_withsiblings(source);
                    return 1;
                }
                break;
            } else if (ret == -1) {
                lyd_free_withsiblings(source);
                return 1;
            } /* else not equal, nothing to do */
        }

        /* sibling not found, insert it */
        if (!trg) {
            if (ctx != src->schema->module->ctx) {
                ins = lyd_dup_to_ctx(src, 1, ctx);
            } else {
                lyd_unlink(src);
                if (src == source) {
                    /* just so source is not freed, we inserted it and need it further */
                    source = src_backup;
                }
                ins = src;
            }
            lyd_insert_after(target->prev, ins);
        }
    }

    lyd_free_withsiblings(source);
    if (clear_flag) {
        return 2;
    }
    return 0;
}